

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::GaussianPlumeRecord
          (GaussianPlumeRecord *this,KUINT8 Index,WorldCoordinates *Location,
          EulerAngles *Orientation,Vector *LWH,Vector *DDT,KFLOAT32 LECH,Vector *LEV)

{
  KFLOAT32 LECH_local;
  Vector *DDT_local;
  Vector *LWH_local;
  EulerAngles *Orientation_local;
  WorldCoordinates *Location_local;
  KUINT8 Index_local;
  GaussianPlumeRecord *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GaussianPlumeRecord_00332668;
  WorldCoordinates::WorldCoordinates(&this->m_SrcLocation,Location);
  EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  Vector::Vector(&this->m_PlumeLWH,LWH);
  Vector::Vector(&this->m_DDTLEH,DDT);
  this->m_f32LdEdgeCenHght = LECH;
  Vector::Vector(&this->m_LdEdgeVel,LEV);
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x60000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x280;
  return;
}

Assistant:

GaussianPlumeRecord::GaussianPlumeRecord( KUINT8 Index, const WorldCoordinates & Location, const EulerAngles & Orientation,
        const Vector & LWH, const Vector & DDT, KFLOAT32 LECH, const Vector & LEV ) :
    m_SrcLocation( Location ),
    m_Ori( Orientation ),
    m_PlumeLWH( LWH ),
    m_DDTLEH( DDT ),
    m_f32LdEdgeCenHght( LECH ),
    m_LdEdgeVel( LEV ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = GaussianPlumeRecordType;
    m_ui16Length = ( GAUSSIAN_PLUME_RECORD_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}